

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaAllocator_T::GetBufferMemoryRequirements
          (VmaAllocator_T *this,VkBuffer hBuffer,VkMemoryRequirements *memReq,
          bool *requiresDedicatedAllocation,bool *prefersDedicatedAllocation)

{
  undefined1 *in_RCX;
  VkDeviceSize *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  VkMemoryRequirements2KHR memReq2;
  VkMemoryDedicatedRequirementsKHR memDedicatedReq;
  VkBufferMemoryRequirementsInfo2KHR memReqInfo;
  VkMemoryRequirements2 local_80;
  VkMemoryDedicatedRequirements local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  VkDeviceSize *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  if (((*(byte *)(in_RDI + 8) & 1) == 0) && (*(uint *)(in_RDI + 4) < 0x401000)) {
    (**(code **)(in_RDI + 0x16a8))(*(undefined8 *)(in_RDI + 0x10),in_RSI,in_RDX);
    *local_20 = 0;
    *local_28 = 0;
  }
  else {
    local_40 = 0x3b9d0450;
    local_38 = 0;
    local_58.sType = VK_STRUCTURE_TYPE_MEMORY_DEDICATED_REQUIREMENTS;
    local_58._4_4_ = 0;
    local_58.pNext = (void *)0x0;
    local_58.prefersDedicatedAllocation = 0;
    local_58.requiresDedicatedAllocation = 0;
    local_18 = in_RDX;
    memset(&local_80,0,0x28);
    local_80.sType = VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2;
    VmaPnextChainPushFront<VkMemoryRequirements2,VkMemoryDedicatedRequirements>(&local_80,&local_58)
    ;
    (**(code **)(in_RDI + 0x16e0))(*(undefined8 *)(in_RDI + 0x10),&local_40,&local_80);
    *local_18 = local_80.memoryRequirements.size;
    local_18[1] = local_80.memoryRequirements.alignment;
    local_18[2] = local_80.memoryRequirements._16_8_;
    *local_20 = local_58.requiresDedicatedAllocation != 0;
    *local_28 = local_58.prefersDedicatedAllocation != 0;
  }
  return;
}

Assistant:

void VmaAllocator_T::GetBufferMemoryRequirements(
    VkBuffer hBuffer,
    VkMemoryRequirements& memReq,
    bool& requiresDedicatedAllocation,
    bool& prefersDedicatedAllocation) const
{
#if VMA_DEDICATED_ALLOCATION || VMA_VULKAN_VERSION >= 1001000
    if(m_UseKhrDedicatedAllocation || m_VulkanApiVersion >= VK_MAKE_VERSION(1, 1, 0))
    {
        VkBufferMemoryRequirementsInfo2KHR memReqInfo = { VK_STRUCTURE_TYPE_BUFFER_MEMORY_REQUIREMENTS_INFO_2_KHR };
        memReqInfo.buffer = hBuffer;

        VkMemoryDedicatedRequirementsKHR memDedicatedReq = { VK_STRUCTURE_TYPE_MEMORY_DEDICATED_REQUIREMENTS_KHR };

        VkMemoryRequirements2KHR memReq2 = { VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2_KHR };
        VmaPnextChainPushFront(&memReq2, &memDedicatedReq);

        (*m_VulkanFunctions.vkGetBufferMemoryRequirements2KHR)(m_hDevice, &memReqInfo, &memReq2);

        memReq = memReq2.memoryRequirements;
        requiresDedicatedAllocation = (memDedicatedReq.requiresDedicatedAllocation != VK_FALSE);
        prefersDedicatedAllocation  = (memDedicatedReq.prefersDedicatedAllocation  != VK_FALSE);
    }
    else
#endif // #if VMA_DEDICATED_ALLOCATION || VMA_VULKAN_VERSION >= 1001000
    {
        (*m_VulkanFunctions.vkGetBufferMemoryRequirements)(m_hDevice, hBuffer, &memReq);
        requiresDedicatedAllocation = false;
        prefersDedicatedAllocation  = false;
    }
}